

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_lemire(uint16_t *array,uint32_t len,uint32_t *flags)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong uVar13;
  uint32_t *in_RDX;
  uint in_ESI;
  uint16_t *in_RDI;
  size_t k_1;
  __m256i eq_2;
  __m256i m_2;
  __m256i input_2;
  size_t maxj;
  size_t j;
  size_t i_2;
  size_t k;
  __m256i eq_1;
  __m256i m_1;
  __m256i input_1;
  size_t i_1;
  uint16_t startbuffer_1 [32];
  __m256i eq;
  __m256i m;
  __m256i input;
  size_t i;
  uint16_t startbuffer [32];
  __m256i count16;
  __m256i bits;
  uint16_t buffer [16];
  ulong local_608;
  ulong local_5a0;
  ulong local_598;
  long local_590;
  ulong local_588;
  ulong local_508;
  undefined8 local_500 [8];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  ulong local_448;
  undefined8 local_440 [7];
  undefined8 local_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  uint32_t *local_3a0;
  uint local_394;
  uint16_t *local_390;
  undefined1 local_300 [16];
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 *local_2a8;
  undefined1 local_2a0 [32];
  undefined2 local_280;
  undefined2 local_27e;
  undefined2 local_27c;
  undefined2 local_27a;
  undefined2 local_278;
  undefined2 local_276;
  undefined2 local_274;
  undefined2 local_272;
  undefined2 local_270;
  undefined2 local_26e;
  undefined2 local_26c;
  undefined2 local_26a;
  undefined2 local_268;
  undefined2 local_266;
  undefined2 local_264;
  undefined2 local_262;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [16];
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_262 = 0x8000;
  local_264 = 0x4000;
  local_266 = 0x2000;
  local_268 = 0x1000;
  local_26a = 0x800;
  local_26c = 0x400;
  local_26e = 0x200;
  local_270 = 0x100;
  local_272 = 0x80;
  local_274 = 0x40;
  local_276 = 0x20;
  local_278 = 0x10;
  local_27a = 8;
  local_27c = 4;
  local_27e = 2;
  local_280 = 1;
  auVar2 = vpinsrw_avx(ZEXT216(0x100),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x400,2);
  auVar2 = vpinsrw_avx(auVar2,0x800,3);
  auVar2 = vpinsrw_avx(auVar2,0x1000,4);
  auVar2 = vpinsrw_avx(auVar2,0x2000,5);
  auVar2 = vpinsrw_avx(auVar2,0x4000,6);
  auVar2 = vpinsrw_avx(auVar2,0x8000,7);
  auVar3 = vpinsrw_avx(ZEXT216(1),2,1);
  auVar3 = vpinsrw_avx(auVar3,4,2);
  auVar3 = vpinsrw_avx(auVar3,8,3);
  auVar3 = vpinsrw_avx(auVar3,0x10,4);
  auVar3 = vpinsrw_avx(auVar3,0x20,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  auVar3 = vpinsrw_avx(auVar3,0x80,7);
  local_2a0._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  local_2a0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  local_3e0 = local_2a0._0_16_;
  auStack_3d0 = local_2a0._16_16_;
  if (in_ESI < 0x40) {
    pospopcnt_u16_scalar_naive(in_RDI,in_ESI,in_RDX);
  }
  else {
    local_180 = 0;
    uStack_178 = 0;
    uStack_170 = 0;
    uStack_168 = 0;
    local_400._0_16_ = ZEXT816(0);
    local_400 = ZEXT1632(local_400._0_16_);
    local_3a0 = in_RDX;
    local_394 = in_ESI;
    local_390 = in_RDI;
    memset(local_440,0,0x40);
    local_440[4] = *(undefined8 *)local_390;
    local_440[5] = *(undefined8 *)(local_390 + 4);
    local_440[6] = *(undefined8 *)(local_390 + 8);
    local_408 = *(undefined8 *)(local_390 + 0xc);
    for (local_448 = 1; local_448 < 0x10; local_448 = local_448 + 1) {
      lVar1 = local_448 * 2;
      local_2a8 = (undefined8 *)((long)local_440 + lVar1);
      local_480 = *local_2a8;
      uStack_478 = *(undefined8 *)((long)local_440 + lVar1 + 8);
      uStack_470 = *(undefined8 *)((long)local_440 + lVar1 + 0x10);
      uStack_468 = *(undefined8 *)((long)local_440 + lVar1 + 0x18);
      uStack_2f0 = auStack_3d0._0_8_;
      uStack_2e8 = auStack_3d0._8_8_;
      auVar9._8_8_ = uStack_478;
      auVar9._0_8_ = local_480;
      auVar9._16_8_ = uStack_470;
      auVar9._24_8_ = uStack_468;
      auVar4._16_8_ = auStack_3d0._0_8_;
      auVar4._0_16_ = local_3e0;
      auVar4._24_8_ = auStack_3d0._8_8_;
      local_4a0 = vpand_avx2(auVar9,auVar4);
      uStack_1b0 = auStack_3d0._0_8_;
      uStack_1a8 = auStack_3d0._8_8_;
      local_1e0 = local_4a0._0_8_;
      uStack_1d8 = local_4a0._8_8_;
      uStack_1d0 = local_4a0._16_8_;
      uStack_1c8 = local_4a0._24_8_;
      auVar12._16_8_ = auStack_3d0._0_8_;
      auVar12._0_16_ = local_3e0;
      auVar12._24_8_ = auStack_3d0._8_8_;
      uVar5 = vpcmpeqw_avx512vl(auVar12,local_4a0);
      local_4c0 = vpmovm2w_avx512vl(uVar5);
      local_c0 = local_400._0_8_;
      uStack_b8 = local_400._8_8_;
      uStack_b0 = local_400._16_8_;
      uStack_a8 = local_400._24_8_;
      local_e0 = local_4c0._0_8_;
      uStack_d8 = local_4c0._8_8_;
      uStack_d0 = local_4c0._16_8_;
      uStack_c8 = local_4c0._24_8_;
      local_400 = vpsubw_avx2(local_400,local_4c0);
      local_2e0 = local_480;
      uStack_2d8 = uStack_478;
      uStack_2d0 = uStack_470;
      uStack_2c8 = uStack_468;
      local_300 = local_3e0;
      local_1c0 = local_3e0;
    }
    memset(local_500,0,0x40);
    uVar13 = (ulong)local_394;
    local_500[1] = *(undefined8 *)(local_390 + (uVar13 - 0xc));
    local_500[2] = *(undefined8 *)(local_390 + (uVar13 - 8));
    local_500[3] = *(undefined8 *)(local_390 + (uVar13 - 4));
    local_508 = 1;
    while( true ) {
      if (0xf < local_508) break;
      lVar1 = local_508 * 2;
      auVar8._8_8_ = *(undefined8 *)((long)local_500 + lVar1 + 8);
      auVar8._0_8_ = *(undefined8 *)((long)local_500 + lVar1);
      auVar8._16_8_ = *(undefined8 *)((long)local_500 + lVar1 + 0x10);
      auVar8._24_8_ = *(undefined8 *)((long)local_500 + lVar1 + 0x18);
      auVar7._16_8_ = auStack_3d0._0_8_;
      auVar7._0_16_ = local_3e0;
      auVar7._24_8_ = auStack_3d0._8_8_;
      auVar4 = vpand_avx2(auVar8,auVar7);
      auVar11._16_8_ = auStack_3d0._0_8_;
      auVar11._0_16_ = local_3e0;
      auVar11._24_8_ = auStack_3d0._8_8_;
      uVar5 = vpcmpeqw_avx512vl(auVar11,auVar4);
      auVar4 = vpmovm2w_avx512vl(uVar5);
      local_400 = vpsubw_avx2(local_400,auVar4);
      local_508 = local_508 + 1;
    }
    local_3c0 = local_400._0_8_;
    uStack_3b8 = local_400._8_8_;
    uStack_3b0 = local_400._16_8_;
    uStack_3a8 = local_400._24_8_;
    for (local_588 = 0; local_588 < 0x10; local_588 = local_588 + 1) {
      local_3a0[local_588] =
           (uint)*(ushort *)((long)&local_3c0 + local_588 * 2) + local_3a0[local_588];
    }
    local_590 = 0;
    while (local_590 + 0x10U <= (ulong)local_394) {
      local_400._0_16_ = ZEXT816(0);
      local_400 = ZEXT1632(local_400._0_16_);
      local_598 = 0;
      local_5a0 = 0xffff;
      if ((ulong)local_394 <= local_590 + 0x1000fU) {
        local_5a0 = ((ulong)local_394 - local_590) - 0xf;
      }
      while( true ) {
        if (local_5a0 <= local_598) break;
        auVar6._16_8_ = auStack_3d0._0_8_;
        auVar6._0_16_ = local_3e0;
        auVar6._24_8_ = auStack_3d0._8_8_;
        auVar4 = vpand_avx2(*(undefined1 (*) [32])(local_390 + local_590 + local_598),auVar6);
        auVar10._16_8_ = auStack_3d0._0_8_;
        auVar10._0_16_ = local_3e0;
        auVar10._24_8_ = auStack_3d0._8_8_;
        uVar5 = vpcmpeqw_avx512vl(auVar10,auVar4);
        auVar4 = vpmovm2w_avx512vl(uVar5);
        local_400 = vpsubw_avx2(local_400,auVar4);
        local_598 = local_598 + 1;
      }
      local_590 = local_598 + local_590;
      local_3c0 = local_400._0_8_;
      uStack_3b8 = local_400._8_8_;
      uStack_3b0 = local_400._16_8_;
      uStack_3a8 = local_400._24_8_;
      for (local_608 = 0; local_608 < 0x10; local_608 = local_608 + 1) {
        local_3a0[local_608] =
             (uint)*(ushort *)((long)&local_3c0 + local_608 * 2) + local_3a0[local_608];
      }
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_lemire(const uint16_t* array, uint32_t len, uint32_t* flags) {
    uint16_t buffer[16];
    __m256i bits = _mm256_set_epi16(-32768, 16384, 8192, 4096, 2048, 1024, 512, 256,
                                       128,    64,   32,   16,    8,    4,   2,   1);
    // we do the first part
    if (len < 64) {
        // don't bother with handcrafted SIMD
        pospopcnt_u16_scalar_naive(array, len, flags);
        return 0;
    }
    // handle the start (naively)
    __m256i count16 = _mm256_setzero_si256();

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer + 16, array, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }

    {
        uint16_t startbuffer[32];
        memset(startbuffer, 0, 32 * 2);
        memcpy(startbuffer, array + len - 16, 16 * 2);
        for (size_t i = 1; i < 16; ++i) {
            __m256i input = _mm256_loadu_si256((__m256i*)(startbuffer + i));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
    }
    
    _mm256_storeu_si256((__m256i*)buffer, count16);
    for (size_t k = 0; k < 16; k++) {
        flags[k] += buffer[k];
    }

    // main loop starts here
    for (size_t i = 0; i + 16 <= len;) {
        count16 = _mm256_setzero_si256();
        size_t j = 0;
        size_t maxj = 65535;

        if (maxj + i + 16 >= len)
            maxj = len - i - 15;

        for (/**/; j < maxj; ++j) {
            __m256i input = _mm256_loadu_si256((__m256i*)(array + i + j));
            __m256i m  = _mm256_and_si256(input, bits);
            __m256i eq = _mm256_cmpeq_epi16(bits, m);
            count16 = _mm256_sub_epi16(count16, eq);
        }
        i += j;
        _mm256_storeu_si256((__m256i*)buffer, count16);
        for (size_t k = 0; k < 16; k++) {
            flags[k] += buffer[k];
        }
    }
    return 0;
}